

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O2

Test * GraphTestCycleInEdgesButNotInNodes3::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x228);
  GraphTestCycleInEdgesButNotInNodes3((GraphTestCycleInEdgesButNotInNodes3 *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST_F(GraphTest, CycleInEdgesButNotInNodes3) {
  string err;
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build a b: cat c\n"
"build c: cat a\n"));
  EXPECT_FALSE(scan_.RecomputeDirty(GetNode("b"), &err));
  ASSERT_EQ("dependency cycle: a -> c -> a", err);
}